

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
::BuiltinPrecisionCaseTestInstance
          (BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
           *this,Context *context,CaseContext *caseCtx,ShaderSpec *shaderSpec,
          Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
          *variables,
          Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *samplings,StatementP *stmt)

{
  ShaderExecutor *pSVar1;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BuiltinPrecisionCaseTestInstance_00be32e8;
  CaseContext::CaseContext(&this->m_caseCtx,caseCtx);
  Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
  ::Variables(&this->m_variables,variables);
  this->m_samplings = samplings;
  de::SharedPtr<const_vkt::shaderexecutor::Statement>::SharedPtr
            (&(this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>,
             &stmt->super_SharedPtr<const_vkt::shaderexecutor::Statement>);
  pSVar1 = createExecutor(context,caseCtx->shaderType,shaderSpec,(VkDescriptorSetLayout)0x0);
  (this->m_executor).
  super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  .m_data.ptr = pSVar1;
  return;
}

Assistant:

BuiltinPrecisionCaseTestInstance	(Context&						context,
																		 const CaseContext				caseCtx,
																		 const ShaderSpec&				shaderSpec,
																		 const Variables<In, Out>		variables,
																		 const Samplings<In>&			samplings,
																		 const StatementP				stmt)
										: TestInstance	(context)
										, m_caseCtx		(caseCtx)
										, m_variables	(variables)
										, m_samplings	(samplings)
										, m_stmt		(stmt)
										, m_executor	(createExecutor(context, caseCtx.shaderType, shaderSpec))
									{
									}